

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

void __thiscall Assimp::Discreet3DSImporter::ParseMaterialChunk(Discreet3DSImporter *this)

{
  StreamReader<false,_false> *this_00;
  char *pcVar1;
  int8_t iVar2;
  bool bVar3;
  int16_t iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  Logger *pLVar8;
  reference pvVar9;
  ai_real aVar10;
  aiColor3D local_b0;
  ai_real local_a4;
  ai_real *paStack_a0;
  ai_real f;
  ai_real *pcf_2;
  ai_real *pcf_1;
  ai_real *pcf;
  aiColor3D *pc_3;
  aiColor3D *pc_2;
  aiColor3D *pc_1;
  aiColor3D *pc;
  allocator local_51;
  string local_50 [36];
  uint local_2c;
  int8_t *piStack_28;
  uint cnt;
  char *sz;
  uint oldReadLimit;
  int chunkSize;
  Discreet3DSImporter *pDStack_10;
  Chunk chunk;
  Discreet3DSImporter *this_local;
  
  pDStack_10 = this;
  do {
    do {
      uVar5 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
      if (uVar5 < 6) {
        return;
      }
      ReadChunk(this,(Chunk *)((long)&oldReadLimit + 2));
      sz._4_4_ = chunkSize + -6;
    } while (sz._4_4_ < 1);
    this_00 = this->stream;
    iVar6 = StreamReader<false,_false>::GetCurrentPos(this_00);
    sz._0_4_ = StreamReader<false,_false>::SetReadLimit(this_00,iVar6 + sz._4_4_);
    if (oldReadLimit._2_2_ == -0x6000) {
      piStack_28 = StreamReader<false,_false>::GetPtr(this->stream);
      local_2c = 0;
      while (iVar2 = StreamReader<false,_false>::GetI1(this->stream), pcVar1 = piStack_28,
            iVar2 != '\0') {
        local_2c = local_2c + 1;
      }
      if (local_2c == 0) {
        pLVar8 = DefaultLogger::get();
        Logger::error(pLVar8,"3DS: Empty material name");
      }
      else {
        uVar7 = (ulong)local_2c;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_50,pcVar1,uVar7,&local_51);
        pvVar9 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::back
                           (&this->mScene->mMaterials);
        std::__cxx11::string::operator=((string *)&pvVar9->mName,local_50);
        std::__cxx11::string::~string(local_50);
        std::allocator<char>::~allocator((allocator<char> *)&local_51);
      }
    }
    else if (oldReadLimit._2_2_ == -0x5ff0) {
      pvVar9 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::back
                         (&this->mScene->mMaterials);
      pc_3 = &pvVar9->mAmbient;
      ParseColorChunk(this,pc_3,true);
      bVar3 = is_qnan(pc_3->r);
      if (bVar3) {
        pLVar8 = DefaultLogger::get();
        Logger::error(pLVar8,"3DS: Unable to read AMBIENT chunk");
        pc_3->b = 0.0;
        pc_3->g = 0.0;
        pc_3->r = 0.0;
      }
    }
    else if (oldReadLimit._2_2_ == -0x5fe0) {
      pvVar9 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::back
                         (&this->mScene->mMaterials);
      pc_1 = &pvVar9->mDiffuse;
      ParseColorChunk(this,pc_1,true);
      bVar3 = is_qnan(pc_1->r);
      if (bVar3) {
        pLVar8 = DefaultLogger::get();
        Logger::error(pLVar8,"3DS: Unable to read DIFFUSE chunk");
        pc_1->b = 1.0;
        pc_1->g = 1.0;
        pc_1->r = 1.0;
      }
    }
    else if (oldReadLimit._2_2_ == -0x5fd0) {
      pvVar9 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::back
                         (&this->mScene->mMaterials);
      pc_2 = &pvVar9->mSpecular;
      ParseColorChunk(this,pc_2,true);
      bVar3 = is_qnan(pc_2->r);
      if (bVar3) {
        pLVar8 = DefaultLogger::get();
        Logger::error(pLVar8,"3DS: Unable to read SPECULAR chunk");
        pc_2->b = 1.0;
        pc_2->g = 1.0;
        pc_2->r = 1.0;
      }
    }
    else if (oldReadLimit._2_2_ == -0x5fc0) {
      pvVar9 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::back
                         (&this->mScene->mMaterials);
      pcf_2 = &pvVar9->mSpecularExponent;
      aVar10 = ParsePercentageChunk(this);
      *pcf_2 = aVar10;
      bVar3 = is_qnan(*pcf_2);
      if (bVar3) {
        *pcf_2 = 0.0;
      }
      else {
        *pcf_2 = *pcf_2 * 65535.0;
      }
    }
    else if (oldReadLimit._2_2_ == -0x5fbf) {
      pvVar9 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::back
                         (&this->mScene->mMaterials);
      paStack_a0 = &pvVar9->mShininessStrength;
      aVar10 = ParsePercentageChunk(this);
      *paStack_a0 = aVar10;
      bVar3 = is_qnan(*paStack_a0);
      if (bVar3) {
        *paStack_a0 = 0.0;
      }
      else {
        *paStack_a0 = *paStack_a0 * 655.35;
      }
    }
    else if (oldReadLimit._2_2_ == -0x5fb0) {
      pvVar9 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::back
                         (&this->mScene->mMaterials);
      pcf_1 = &pvVar9->mTransparency;
      aVar10 = ParsePercentageChunk(this);
      *pcf_1 = aVar10;
      bVar3 = is_qnan(*pcf_1);
      if (bVar3) {
        *pcf_1 = 1.0;
      }
      else {
        *pcf_1 = 1.0 - (*pcf_1 * 65535.0) / 100.0;
      }
    }
    else if (oldReadLimit._2_2_ == -0x5f80) {
      pvVar9 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::back
                         (&this->mScene->mMaterials);
      pcf = &(pvVar9->mEmissive).r;
      ParseColorChunk(this,(aiColor3D *)pcf,true);
      bVar3 = is_qnan(*pcf);
      if (bVar3) {
        pLVar8 = DefaultLogger::get();
        Logger::error(pLVar8,"3DS: Unable to read EMISSIVE chunk");
        pcf[2] = 0.0;
        pcf[1] = 0.0;
        *pcf = 0.0;
      }
    }
    else if (oldReadLimit._2_2_ == -0x5f7f) {
      pvVar9 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::back
                         (&this->mScene->mMaterials);
      pvVar9->mTwoSided = true;
    }
    else if (oldReadLimit._2_2_ == -0x5f7c) {
      local_a4 = ParsePercentageChunk(this);
      bVar3 = is_qnan(local_a4);
      if (bVar3) {
        local_a4 = 0.0;
      }
      else {
        local_a4 = local_a4 * 655.35;
      }
      aiColor3D::aiColor3D(&local_b0,local_a4,local_a4,local_a4);
      pvVar9 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::back
                         (&this->mScene->mMaterials);
      aiColor3D::operator=(&pvVar9->mEmissive,&local_b0);
    }
    else if (oldReadLimit._2_2_ == -0x5f00) {
      iVar4 = StreamReader<false,_false>::GetI2(this->stream);
      pvVar9 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::back
                         (&this->mScene->mMaterials);
      pvVar9->mShading = (int)iVar4;
    }
    else if (oldReadLimit._2_2_ == -0x5e00) {
      pvVar9 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::back
                         (&this->mScene->mMaterials);
      ParseTextureChunk(this,&pvVar9->sTexDiffuse);
    }
    else if (oldReadLimit._2_2_ == -0x5dfc) {
      pvVar9 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::back
                         (&this->mScene->mMaterials);
      ParseTextureChunk(this,&pvVar9->sTexSpecular);
    }
    else if (oldReadLimit._2_2_ == -0x5df0) {
      pvVar9 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::back
                         (&this->mScene->mMaterials);
      ParseTextureChunk(this,&pvVar9->sTexOpacity);
    }
    else if (oldReadLimit._2_2_ == -0x5de0) {
      pvVar9 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::back
                         (&this->mScene->mMaterials);
      ParseTextureChunk(this,&pvVar9->sTexReflective);
    }
    else if (oldReadLimit._2_2_ == -0x5dd0) {
      pvVar9 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::back
                         (&this->mScene->mMaterials);
      ParseTextureChunk(this,&pvVar9->sTexBump);
    }
    else if (oldReadLimit._2_2_ == -0x5cc4) {
      pvVar9 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::back
                         (&this->mScene->mMaterials);
      ParseTextureChunk(this,&pvVar9->sTexShininess);
    }
    else if (oldReadLimit._2_2_ == -0x5cc3) {
      pvVar9 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::back
                         (&this->mScene->mMaterials);
      ParseTextureChunk(this,&pvVar9->sTexEmissive);
    }
    StreamReader<false,_false>::SkipToReadLimit(this->stream);
    StreamReader<false,_false>::SetReadLimit(this->stream,(uint)sz);
    uVar5 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
  } while (uVar5 != 0);
  return;
}

Assistant:

void Discreet3DSImporter::ParseMaterialChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_MAT_MATNAME:

        {
        // The material name string is already zero-terminated, but we need to be sure ...
        const char* sz = (const char*)stream->GetPtr();
        unsigned int cnt = 0;
        while (stream->GetI1())
            ++cnt;

        if (!cnt)   {
            // This may not be, we use the default name instead
            ASSIMP_LOG_ERROR("3DS: Empty material name");
        }
        else mScene->mMaterials.back().mName = std::string(sz,cnt);
        }
        break;

    case Discreet3DS::CHUNK_MAT_DIFFUSE:
        {
        // This is the diffuse material color
        aiColor3D* pc = &mScene->mMaterials.back().mDiffuse;
        ParseColorChunk(pc);
        if (is_qnan(pc->r)) {
            // color chunk is invalid. Simply ignore it
            ASSIMP_LOG_ERROR("3DS: Unable to read DIFFUSE chunk");
            pc->r = pc->g = pc->b = 1.0f;
        }}
        break;

    case Discreet3DS::CHUNK_MAT_SPECULAR:
        {
        // This is the specular material color
        aiColor3D* pc = &mScene->mMaterials.back().mSpecular;
        ParseColorChunk(pc);
        if (is_qnan(pc->r)) {
            // color chunk is invalid. Simply ignore it
            ASSIMP_LOG_ERROR("3DS: Unable to read SPECULAR chunk");
            pc->r = pc->g = pc->b = 1.0f;
        }}
        break;

    case Discreet3DS::CHUNK_MAT_AMBIENT:
        {
        // This is the ambient material color
        aiColor3D* pc = &mScene->mMaterials.back().mAmbient;
        ParseColorChunk(pc);
        if (is_qnan(pc->r)) {
            // color chunk is invalid. Simply ignore it
            ASSIMP_LOG_ERROR("3DS: Unable to read AMBIENT chunk");
            pc->r = pc->g = pc->b = 0.0f;
        }}
        break;

    case Discreet3DS::CHUNK_MAT_SELF_ILLUM:
        {
        // This is the emissive material color
        aiColor3D* pc = &mScene->mMaterials.back().mEmissive;
        ParseColorChunk(pc);
        if (is_qnan(pc->r)) {
            // color chunk is invalid. Simply ignore it
            ASSIMP_LOG_ERROR("3DS: Unable to read EMISSIVE chunk");
            pc->r = pc->g = pc->b = 0.0f;
        }}
        break;

    case Discreet3DS::CHUNK_MAT_TRANSPARENCY:
        {
            // This is the material's transparency
            ai_real* pcf = &mScene->mMaterials.back().mTransparency;
            *pcf = ParsePercentageChunk();

            // NOTE: transparency, not opacity
            if (is_qnan(*pcf))
                *pcf = ai_real( 1.0 );
            else 
                *pcf = ai_real( 1.0 ) - *pcf * (ai_real)0xFFFF / ai_real( 100.0 );
        }
        break;

    case Discreet3DS::CHUNK_MAT_SHADING:
        // This is the material shading mode
        mScene->mMaterials.back().mShading = (D3DS::Discreet3DS::shadetype3ds)stream->GetI2();
        break;

    case Discreet3DS::CHUNK_MAT_TWO_SIDE:
        // This is the two-sided flag
        mScene->mMaterials.back().mTwoSided = true;
        break;

    case Discreet3DS::CHUNK_MAT_SHININESS:
        { // This is the shininess of the material
        ai_real* pcf = &mScene->mMaterials.back().mSpecularExponent;
        *pcf = ParsePercentageChunk();
        if (is_qnan(*pcf))
            *pcf = 0.0;
        else *pcf *= (ai_real)0xFFFF;
        }
        break;

    case Discreet3DS::CHUNK_MAT_SHININESS_PERCENT:
        { // This is the shininess strength of the material
            ai_real* pcf = &mScene->mMaterials.back().mShininessStrength;
            *pcf = ParsePercentageChunk();
            if (is_qnan(*pcf))
                *pcf = ai_real( 0.0 );
            else 
                *pcf *= (ai_real)0xffff / ai_real( 100.0 );
        }
        break;

    case Discreet3DS::CHUNK_MAT_SELF_ILPCT:
        { // This is the self illumination strength of the material
            ai_real f = ParsePercentageChunk();
            if (is_qnan(f))
                f = ai_real( 0.0 );
            else 
                f *= (ai_real)0xFFFF / ai_real( 100.0 );
            mScene->mMaterials.back().mEmissive = aiColor3D(f,f,f);
        }
        break;

    // Parse texture chunks
    case Discreet3DS::CHUNK_MAT_TEXTURE:
        // Diffuse texture
        ParseTextureChunk(&mScene->mMaterials.back().sTexDiffuse);
        break;
    case Discreet3DS::CHUNK_MAT_BUMPMAP:
        // Height map
        ParseTextureChunk(&mScene->mMaterials.back().sTexBump);
        break;
    case Discreet3DS::CHUNK_MAT_OPACMAP:
        // Opacity texture
        ParseTextureChunk(&mScene->mMaterials.back().sTexOpacity);
        break;
    case Discreet3DS::CHUNK_MAT_MAT_SHINMAP:
        // Shininess map
        ParseTextureChunk(&mScene->mMaterials.back().sTexShininess);
        break;
    case Discreet3DS::CHUNK_MAT_SPECMAP:
        // Specular map
        ParseTextureChunk(&mScene->mMaterials.back().sTexSpecular);
        break;
    case Discreet3DS::CHUNK_MAT_SELFIMAP:
        // Self-illumination (emissive) map
        ParseTextureChunk(&mScene->mMaterials.back().sTexEmissive);
        break;
    case Discreet3DS::CHUNK_MAT_REFLMAP:
        // Reflection map
        ParseTextureChunk(&mScene->mMaterials.back().sTexReflective);
        break;
    };
    ASSIMP_3DS_END_CHUNK();
}